

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_DecList(ast *node)

{
  ast *node_00;
  ast *paVar1;
  ast *paVar2;
  ast *node_01;
  char *v;
  int size;
  string local_148;
  undefined1 local_128 [48];
  undefined1 local_f8 [48];
  InterCode local_c8;
  
  node_00 = child(node,3);
  paVar1 = child(node,1);
  paVar2 = child(paVar1,3);
  size = 0;
  node_01 = child(paVar1,1);
  v = TR_VarDec(node_01,&size);
  if (size != 0) {
    Operand::Operand((Operand *)local_128,v);
    std::__cxx11::to_string(&local_148,size);
    Operand::Operand((Operand *)local_f8,&local_148);
    IrSim::icDec(&local_c8,&irSim,(C_OP *)local_128,(Operand *)local_f8);
    IrSim::commitIc(&irSim,&local_c8);
    InterCode::~InterCode(&local_c8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)(local_128 + 8));
  }
  if (paVar2 != (ast *)0x0) {
    paVar1 = child(paVar1,2);
    TR_ASSIGNOP(paVar1,&OP_NONE);
  }
  if (node_00 != (ast *)0x0) {
    TR_DecList(node_00);
  }
  return;
}

Assistant:

static void TR_DecList(ast *node) {
    ast *c3 = child(node, 3);
    TR_Dec(child(node, 1));
    if (c3) TR_DecList(c3);
}